

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O0

bool __thiscall xemmai::io::t_writer::f_write(t_writer *this,t_io *a_library,char **a_p,size_t *a_n)

{
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  size_t *a_n_local;
  char **a_p_local;
  t_io *a_library_local;
  t_writer *this_local;
  
  while( true ) {
    do {
      sVar2 = iconv((this->super_t_iconv).v_cd,a_p,a_n,&this->v_p1,&this->v_n1);
      if (sVar2 != 0xffffffffffffffff) {
        return true;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if (*piVar3 != 7) break;
    bVar1 = f_write(this,a_library);
    if (!bVar1) {
      return false;
    }
  }
  portable::f_throw_system_error();
}

Assistant:

bool t_writer::f_write(t_io* a_library, char** a_p, size_t* a_n)
{
	while (iconv(v_cd, a_p, a_n, &v_p1, &v_n1) == size_t(-1)) {
		switch (errno) {
		case E2BIG:
			if (!f_write(a_library)) return false;
		case EINTR:
			break;
		default:
			portable::f_throw_system_error();
		}
	}
	return true;
}